

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.h
# Opt level: O2

int __thiscall rengine::Signal<>::connect(Signal<> *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  int extraout_EAX;
  Bucket *pBVar1;
  vector<rengine::SignalEmitter::BucketBase*,std::allocator<rengine::SignalEmitter::BucketBase*>>
  *this_00;
  undefined4 in_register_00000034;
  SignalEmitter *emitter;
  Bucket *local_30;
  sockaddr *local_28;
  SignalHandler<> *handler_local;
  
  emitter = (SignalEmitter *)CONCAT44(in_register_00000034,__fd);
  local_28 = __addr;
  pBVar1 = findBucket(this,emitter);
  if (pBVar1 == (Bucket *)0x0) {
    pBVar1 = (Bucket *)operator_new(0x28);
    (pBVar1->super_BucketBase)._vptr_BucketBase = (_func_int **)&PTR__Bucket_00147620;
    (pBVar1->handlers).
    super__Vector_base<rengine::SignalHandler<>_*,_std::allocator<rengine::SignalHandler<>_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (pBVar1->handlers).
    super__Vector_base<rengine::SignalHandler<>_*,_std::allocator<rengine::SignalHandler<>_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pBVar1->handlers).
    super__Vector_base<rengine::SignalHandler<>_*,_std::allocator<rengine::SignalHandler<>_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pBVar1->super_BucketBase).signal = &this->super_SignalBase;
    this_00 = (vector<rengine::SignalEmitter::BucketBase*,std::allocator<rengine::SignalEmitter::BucketBase*>>
               *)emitter->m_buckets;
    if (this_00 ==
        (vector<rengine::SignalEmitter::BucketBase*,std::allocator<rengine::SignalEmitter::BucketBase*>>
         *)0x0) {
      this_00 = (vector<rengine::SignalEmitter::BucketBase*,std::allocator<rengine::SignalEmitter::BucketBase*>>
                 *)operator_new(0x18);
      *(undefined8 *)this_00 = 0;
      *(pointer *)(this_00 + 8) = (pointer)0x0;
      *(pointer *)(this_00 + 0x10) = (pointer)0x0;
      emitter->m_buckets =
           (vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
            *)this_00;
    }
    local_30 = pBVar1;
    std::
    vector<rengine::SignalEmitter::BucketBase*,std::allocator<rengine::SignalEmitter::BucketBase*>>
    ::emplace_back<rengine::SignalEmitter::BucketBase*>(this_00,(BucketBase **)&local_30);
  }
  std::vector<rengine::SignalHandler<>_*,_std::allocator<rengine::SignalHandler<>_*>_>::push_back
            (&pBVar1->handlers,(value_type *)&local_28);
  return extraout_EAX;
}

Assistant:

void connect(SignalEmitter *emitter, SignalHandler<Arguments ...> *handler)
    {
        Bucket *bucket = findBucket(emitter);
        if (!bucket) {
            bucket = new Bucket();
            bucket->signal = this;
            if (!emitter->m_buckets) {
                emitter->m_buckets = new std::vector<SignalEmitter::BucketBase *>();
            }
            emitter->m_buckets->push_back(bucket);
        }
        bucket->handlers.push_back(handler);
    }